

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_utility.cpp
# Opt level: O3

void __thiscall
FNodeBuilder::FindPolyContainers
          (FNodeBuilder *this,TArray<FNodeBuilder::FPolyStart,_FNodeBuilder::FPolyStart> *spots,
          TArray<FNodeBuilder::FPolyStart,_FNodeBuilder::FPolyStart> *anchors)

{
  undefined8 uVar1;
  int iVar2;
  FPolyStart *pFVar3;
  FPrivVert *pFVar4;
  undefined4 uVar5;
  bool bVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  int *piVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  int iVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  fixed_t bbox [4];
  int local_58;
  int local_48 [3];
  int iStack_3c;
  
  if (spots->Count != 0) {
    local_58 = 1;
    uVar15 = 0;
    do {
      pFVar3 = spots->Array;
      bVar6 = GetPolyExtents(this,pFVar3[uVar15].polynum,local_48);
      if ((bVar6) && ((ulong)anchors->Count != 0)) {
        pFVar3 = pFVar3 + uVar15;
        lVar10 = 0;
        do {
          if (*(int *)((long)&anchors->Array->polynum + lVar10) == pFVar3->polynum) {
            uVar7 = (ulong)(this->Segs).Count;
            if (uVar7 != 0) {
              pFVar4 = (this->Vertices).Array;
              uVar1 = *(undefined8 *)((long)&anchors->Array->x + lVar10);
              uVar5 = pFVar3->y;
              iVar16 = SUB84((double)(SUB84((double)((local_48[0] - (int)local_48._4_8_) / 2 +
                                                    (int)local_48._4_8_) * 1.52587890625e-05 +
                                            103079215104.0,0) +
                                     (uVar5 - (int)((ulong)uVar1 >> 0x20))) * 1.52587890625e-05 +
                             103079215104.0,0);
              piVar12 = &((this->Segs).Array)->v2;
              uVar11 = 0xffffffff;
              iVar13 = 0x7fffffff;
              uVar9 = 0;
              do {
                iVar14 = pFVar4[*piVar12].super_FSimpleVert.y;
                iVar2 = pFVar4[((FPrivSeg *)(piVar12 + -1))->v1].super_FSimpleVert.y;
                iVar8 = iVar14 - iVar2;
                if (((iVar8 != 0) && ((iVar16 <= iVar14 || (iVar16 <= iVar2)))) &&
                   ((iVar14 <= iVar16 || (iVar2 <= iVar16)))) {
                  iVar14 = pFVar4[((FPrivSeg *)(piVar12 + -1))->v1].super_FSimpleVert.x;
                  lVar10 = (long)pFVar4[*piVar12].super_FSimpleVert.x - (long)iVar14;
                  dVar18 = (double)iVar8;
                  dVar19 = (double)(int)lVar10;
                  dVar17 = ((double)iVar2 - (double)iVar16) * dVar19 -
                           ((double)iVar14 -
                           (double)SUB84((double)(SUB84((double)((iStack_3c -
                                                                 SUB84(local_48._4_8_,4)) / 2 +
                                                                SUB84(local_48._4_8_,4)) *
                                                        1.52587890625e-05 + 103079215104.0,0) +
                                                 (pFVar3->x - (int)uVar1)) * 1.52587890625e-05 +
                                         103079215104.0,0)) * dVar18;
                  if ((((ABS(dVar17) < 17179869184.0) &&
                       ((dVar17 * dVar17) / (dVar19 * dVar19 + dVar18 * dVar18) < 42.94967296)) ||
                      (0.0 < dVar17)) &&
                     (iVar14 = (iVar14 - pFVar3->x) +
                               (int)((ulong)((int)(((long)(iVar16 - iVar2) << 0x1e) / (long)iVar8) *
                                            lVar10) >> 0x1e), iVar14 < iVar13 && -1 < iVar14)) {
                    uVar11 = uVar9 & 0xffffffff;
                    iVar13 = iVar14;
                  }
                }
                uVar9 = uVar9 + 1;
                piVar12 = piVar12 + 0x12;
              } while (uVar7 != uVar9);
              if ((DWORD)uVar11 != 0xffffffff) {
                local_58 = MarkLoop(this,(DWORD)uVar11,local_58);
              }
            }
            break;
          }
          lVar10 = lVar10 + 0xc;
        } while ((ulong)anchors->Count * 0xc != lVar10);
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 < spots->Count);
  }
  return;
}

Assistant:

void FNodeBuilder::FindPolyContainers (TArray<FPolyStart> &spots, TArray<FPolyStart> &anchors)
{
	int loop = 1;

	for (unsigned int i = 0; i < spots.Size(); ++i)
	{
		FPolyStart *spot = &spots[i];
		fixed_t bbox[4];

		if (GetPolyExtents (spot->polynum, bbox))
		{
			FPolyStart *anchor = NULL;

			unsigned int j;

			for (j = 0; j < anchors.Size(); ++j)
			{
				anchor = &anchors[j];
				if (anchor->polynum == spot->polynum)
				{
					break;
				}
			}

			if (j < anchors.Size())
			{
				vertex_t mid;
				vertex_t center;

				mid.set(bbox[BOXLEFT] + (bbox[BOXRIGHT]-bbox[BOXLEFT])/2,
						bbox[BOXBOTTOM] + (bbox[BOXTOP]-bbox[BOXBOTTOM])/2);

				center.set(mid.fixX() - anchor->x + spot->x,
							mid.fixY() - anchor->y + spot->y);

				// Scan right for the seg closest to the polyobject's center after it
				// gets moved to its start spot.
				fixed_t closestdist = FIXED_MAX;
				unsigned int closestseg = UINT_MAX;

				P(Printf ("start %d,%d -- center %d, %d\n", spot->x>>16, spot->y>>16, center.fixX()>>16, center.fixY()>>16));

				for (unsigned int j = 0; j < Segs.Size(); ++j)
				{
					FPrivSeg *seg = &Segs[j];
					FPrivVert *v1 = &Vertices[seg->v1];
					FPrivVert *v2 = &Vertices[seg->v2];
					fixed_t dy = v2->y - v1->y;

					if (dy == 0)
					{ // Horizontal, so skip it
						continue;
					}
					if ((v1->y < center.fixY() && v2->y < center.fixY()) || (v1->y > center.fixY() && v2->y > center.fixY()))
					{ // Not crossed
						continue;
					}

					fixed_t dx = v2->x - v1->x;

					if (PointOnSide (center.fixX(), center.fixY(), v1->x, v1->y, dx, dy) <= 0)
					{
						fixed_t t = DivScale30 (center.fixY() - v1->y, dy);
						fixed_t sx = v1->x + MulScale30 (dx, t);
						fixed_t dist = sx - spot->x;

						if (dist < closestdist && dist >= 0)
						{
							closestdist = dist;
							closestseg = (long)j;
						}
					}
				}
				if (closestseg != UINT_MAX)
				{
					loop = MarkLoop (closestseg, loop);
					P(Printf ("Found polyobj in sector %d (loop %d)\n", Segs[closestseg].frontsector,
						Segs[closestseg].loopnum));
				}
			}
		}
	}
}